

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvamemtiming.c
# Opt level: O0

int parse_cmd_line(int argc,char **argv,nvamemtiming_conf *conf)

{
  int iVar1;
  int local_28;
  int local_24;
  int val;
  int c;
  nvamemtiming_conf *conf_local;
  char **argv_local;
  int argc_local;
  
  conf->cnum = 0;
  conf->mmiotrace = false;
  conf->mode = MODE_AUTO;
  (conf->vbios).file = (char *)0x0;
  (conf->field_4).manual.index = 0xff;
  (conf->field_4).manual.value = 0xff;
  _val = conf;
  conf_local = (nvamemtiming_conf *)argv;
  argv_local._0_4_ = argc;
  while (local_24 = getopt((int)argv_local,(char **)conf_local,"hts:f:d:b:c:e:v:"), local_24 != -1)
  {
    switch(local_24) {
    case 0x62:
      if (_val->mode != MODE_AUTO) {
        usage((int)argv_local,(char **)conf_local);
      }
      _val->mode = MODE_BITFIELD;
      __isoc99_sscanf(_optarg,"%d",&local_28);
      (_val->field_4).manual.index = (uint8_t)local_28;
      break;
    case 99:
      __isoc99_sscanf(_optarg,"%d",&local_28);
      _val->cnum = local_28;
      break;
    case 100:
      if (_val->mode != MODE_AUTO) {
        usage((int)argv_local,(char **)conf_local);
      }
      _val->mode = MODE_DEEP;
      __isoc99_sscanf(_optarg,"%d",&local_28);
      (_val->field_4).manual.index = (uint8_t)local_28;
      break;
    case 0x65:
      if ((_val->mode != MODE_AUTO) && (_val->mode != MODE_MANUAL)) {
        usage((int)argv_local,(char **)conf_local);
      }
      _val->mode = MODE_MANUAL;
      __isoc99_sscanf(_optarg,"%d",&local_28);
      (_val->field_4).manual.index = (uint8_t)local_28;
      break;
    case 0x66:
      if (_val->mode != MODE_AUTO) {
        usage((int)argv_local,(char **)conf_local);
      }
      __isoc99_sscanf(_optarg,"%d",&local_28);
      (_val->field_4).manual.value = (uint8_t)local_28;
      break;
    case 0x68:
      usage((int)argv_local,(char **)conf_local);
      break;
    case 0x73:
      if (_val->mode != MODE_AUTO) {
        usage((int)argv_local,(char **)conf_local);
      }
      __isoc99_sscanf(_optarg,"%d",&local_28);
      (_val->field_4).manual.index = (uint8_t)local_28;
      break;
    case 0x74:
      _val->mmiotrace = true;
      break;
    case 0x76:
      if ((_val->mode != MODE_AUTO) && (_val->mode != MODE_MANUAL)) {
        usage((int)argv_local,(char **)conf_local);
      }
      _val->mode = MODE_MANUAL;
      __isoc99_sscanf(_optarg,"%d",&local_28);
      (_val->field_4).manual.value = (uint8_t)local_28;
    }
  }
  if (_val->cnum < nva_cardsnum) {
    if ((int)argv_local != _optind + 4) {
      usage((int)argv_local,(char **)conf_local);
    }
    (_val->vbios).file = *(char **)(&conf_local->cnum + (long)_optind * 2);
    __isoc99_sscanf(*(undefined8 *)(&conf_local->cnum + (long)(_optind + 1) * 2),"%hx",
                    &(_val->vbios).timing_table_offset);
    iVar1 = atoi(*(char **)(&conf_local->cnum + (long)(_optind + 2) * 2));
    (_val->timing).entry = (uint8_t)iVar1;
    iVar1 = atoi(*(char **)(&conf_local->cnum + (long)(_optind + 3) * 2));
    (_val->timing).perflvl = (uint8_t)iVar1;
    argv_local._4_4_ = 0;
  }
  else {
    if (nva_cardsnum == 0) {
      fprintf(_stderr,"No cards found.\n");
    }
    else {
      fprintf(_stderr,"No such card.\n");
    }
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int parse_cmd_line(int argc, char **argv, struct nvamemtiming_conf *conf)
{
	int c, val;

	conf->cnum = 0;
	conf->mmiotrace = false;
	conf->mode = MODE_AUTO;
	conf->vbios.file = NULL;
	conf->range.start = -1;
	conf->range.end = -1;

	while ((c = getopt (argc, argv, "hts:f:d:b:c:e:v:")) != -1)
		switch (c) {
			case 'e':
				if (conf->mode != MODE_AUTO && conf->mode != MODE_MANUAL)
					usage(argc, argv);
				conf->mode = MODE_MANUAL;
				sscanf(optarg, "%d", &val);
				conf->manual.index = val;
				break;
			case 'v':
				if (conf->mode != MODE_AUTO && conf->mode != MODE_MANUAL)
					usage(argc, argv);
				conf->mode = MODE_MANUAL;
				sscanf(optarg, "%d", &val);
				conf->manual.value = val;
				break;
			case 'd':
				if (conf->mode != MODE_AUTO)
					usage(argc, argv);
				conf->mode = MODE_DEEP;
				sscanf(optarg, "%d", &val);
				conf->deep.entry = val;
				break;
			case 'b':
				if (conf->mode != MODE_AUTO)
					usage(argc, argv);
				conf->mode = MODE_BITFIELD;
				sscanf(optarg, "%d", &val);
				conf->bitfield.index = val;
				break;
			case 's':
				if (conf->mode != MODE_AUTO)
					usage(argc, argv);
				sscanf(optarg, "%d", &val);
				conf->range.start = val;
				break;
			case 'f':
				if (conf->mode != MODE_AUTO)
					usage(argc, argv);
				sscanf(optarg, "%d", &val);
				conf->range.end = val;
				break;
			case 'c':
				sscanf(optarg, "%d", &val);
				conf->cnum = val;
				break;
			case 't':
				conf->mmiotrace = true;
				break;
			case 'h':
				usage(argc, argv);
		}
	if (conf->cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	if (argc != optind + 4)
		usage(argc, argv);

	conf->vbios.file = argv[optind];
	sscanf(argv[optind + 1], "%hx", &conf->vbios.timing_table_offset);
	conf->timing.entry = atoi(argv[optind + 2]);
	conf->timing.perflvl = atoi(argv[optind + 3]);

	return 0;
}